

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O1

OP1aHeader * __thiscall
ASDCP::MXF::OP1aHeader::WriteToFile(OP1aHeader *this,FileWriter *Writer,ui32_t HeaderSize)

{
  uint uVar1;
  long *plVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  UL *PartitionLabel;
  OP1aHeader *this_00;
  int iVar5;
  ILogSink *pIVar6;
  MDDEntry *pMVar7;
  uint in_ECX;
  undefined4 in_register_00000014;
  undefined1 *puVar8;
  long *plVar9;
  uint uVar10;
  FrameBuffer WriteWrapper;
  FrameBuffer HeaderBuffer;
  ui32_t write_count;
  Result_t result;
  FrameBuffer local_2c8;
  FrameBuffer local_2a0;
  ulong local_278;
  UL *local_270;
  OP1aHeader *local_268;
  FileWriter *local_260;
  undefined1 local_258 [104];
  FrameBuffer local_1f0 [2];
  undefined **local_188;
  byte_t local_180;
  byte_t local_17f [4];
  byte_t abStack_17b [19];
  Result_t local_168 [104];
  Result_t local_100 [104];
  FrameBuffer local_98 [2];
  
  if (*(long *)(Writer + 0x78) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x3c5,
                  "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter &, ui32_t)"
                 );
  }
  if (*(long *)(Writer + 0x210) == 0) {
    puVar8 = Kumu::RESULT_STATE;
LAB_001a8810:
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar8);
    return this;
  }
  if (in_ECX < 0x1000) {
    pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar6,"HeaderSize %u is too small. Must be >= 4096\n",(ulong)in_ECX);
    puVar8 = Kumu::RESULT_PARAM;
    goto LAB_001a8810;
  }
  FrameBuffer::FrameBuffer(&local_2a0);
  iVar5 = (**(code **)(*(long *)Writer + 0x78))(Writer);
  *(ulong *)(Writer + 0xa0) = (ulong)(in_ECX - iVar5);
  local_278 = (ulong)in_ECX;
  local_270 = (UL *)CONCAT44(in_register_00000014,HeaderSize);
  local_268 = this;
  FrameBuffer::Capacity((FrameBuffer *)(local_258 + 0x68),(ui32_t)&local_2a0);
  local_260 = Writer + 0x1b0;
  *(FileWriter **)(*(long *)(Writer + 0x210) + 0x50) = local_260;
  plVar9 = (long *)**(long **)(Writer + 0x70);
  if ((plVar9 != *(long **)(Writer + 0x70)) && (-1 < (int)(ui32_t)local_1f0[0]._vptr_FrameBuffer)) {
    do {
      plVar2 = (long *)plVar9[2];
      plVar2[10] = (long)local_260;
      FrameBuffer::FrameBuffer(&local_2c8);
      FrameBuffer::SetData(local_98,(byte_t *)&local_2c8,local_2a0.m_Size + (int)local_2a0.m_Data);
      Kumu::Result_t::~Result_t((Result_t *)local_98);
      (**(code **)(*plVar2 + 0x70))((Result_t *)local_258,plVar2,&local_2c8);
      Kumu::Result_t::operator=((Result_t *)(local_258 + 0x68),(Result_t *)local_258);
      Kumu::Result_t::~Result_t((Result_t *)local_258);
      local_2a0.m_Size = local_2a0.m_Size + local_2c8.m_Size;
      FrameBuffer::~FrameBuffer(&local_2c8);
      plVar9 = (long *)*plVar9;
      if (plVar9 == (long *)*(long *)(Writer + 0x70)) break;
    } while (-1 < (int)(ui32_t)local_1f0[0]._vptr_FrameBuffer);
  }
  this_00 = local_268;
  PartitionLabel = local_270;
  if (-1 < (int)(ui32_t)local_1f0[0]._vptr_FrameBuffer) {
    pMVar7 = Dictionary::Type(*(Dictionary **)(Writer + 0x78),MDD_ClosedCompleteHeader);
    local_2c8.m_Data._0_1_ = 1;
    local_2c8.m_Data._1_7_ = (undefined7)*(undefined8 *)pMVar7->ul;
    local_2c8.m_Capacity._0_1_ = (undefined1)((ulong)*(undefined8 *)pMVar7->ul >> 0x38);
    local_2c8._17_7_ = SUB87(*(undefined8 *)(pMVar7->ul + 8),0);
    local_2c8.m_Size._0_1_ = (undefined1)((ulong)*(undefined8 *)(pMVar7->ul + 8) >> 0x38);
    local_2c8._vptr_FrameBuffer = (_func_int **)&PTR__IArchive_0021f038;
    Partition::WriteToFile((Partition *)local_258,Writer,PartitionLabel);
    Kumu::Result_t::operator=((Result_t *)(local_258 + 0x68),(Result_t *)local_258);
    Kumu::Result_t::~Result_t((Result_t *)local_258);
  }
  if (-1 < (int)(ui32_t)local_1f0[0]._vptr_FrameBuffer) {
    Primer::WriteToFile((Primer *)local_258,Writer + 0x140);
    Kumu::Result_t::operator=((Result_t *)(local_258 + 0x68),(Result_t *)local_258);
    Kumu::Result_t::~Result_t((Result_t *)local_258);
  }
  uVar4 = local_278;
  if (-1 < (int)(ui32_t)local_1f0[0]._vptr_FrameBuffer) {
    Kumu::FileWriter::Write((uchar *)local_100,(uint)PartitionLabel,(uint *)local_2a0.m_Data);
    Kumu::Result_t::~Result_t(local_100);
    if (local_258._0_4_ != local_2a0.m_Size) {
      __assert_fail("write_count == HeaderBuffer.Size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                    ,0x3ef,
                    "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter &, ui32_t)"
                   );
    }
  }
  if (-1 < (int)(ui32_t)local_1f0[0]._vptr_FrameBuffer) {
    (*(PartitionLabel->super_Identifier<16U>).super_IArchive._vptr_IArchive[6])
              (local_258,PartitionLabel,&local_2c8);
    Kumu::Result_t::~Result_t((Result_t *)local_258);
    pp_Var3 = local_2c8._vptr_FrameBuffer;
    if (*(long *)(Writer + 0xa0) < (long)local_2c8._vptr_FrameBuffer) {
      pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
      snprintf(local_258,0x40,"%llu",pp_Var3);
      Kumu::ILogSink::Error
                (pIVar6,"Header size %s exceeds specified value %u\n",local_258,uVar4 & 0xffffffff);
      Kumu::Result_t::Result_t((Result_t *)this_00,(Result_t *)Kumu::RESULT_FAIL);
      goto LAB_001a8c23;
    }
    FrameBuffer::FrameBuffer(&local_2c8);
    uVar10 = (int)uVar4 - (int)pp_Var3;
    if (uVar10 < 0x14) {
      pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar6,"Remaining region too small for KLV Fill header\n");
      Kumu::Result_t::Result_t((Result_t *)this_00,(Result_t *)Kumu::RESULT_FAIL);
    }
    else {
      pMVar7 = Dictionary::Type(*(Dictionary **)(Writer + 0x78),MDD_KLVFill);
      uVar1 = uVar10 - 0x14;
      local_180 = '\x01';
      local_17f = *(byte_t (*) [4])pMVar7->ul;
      abStack_17b._0_4_ = *(undefined4 *)(pMVar7->ul + 4);
      abStack_17b[4] = pMVar7->ul[8];
      abStack_17b[5] = pMVar7->ul[9];
      abStack_17b[6] = pMVar7->ul[10];
      abStack_17b[7] = pMVar7->ul[0xb];
      abStack_17b._8_4_ = *(undefined4 *)(pMVar7->ul + 0xc);
      local_188 = &PTR__IArchive_0021f038;
      (**(code **)(*(long *)Writer + 0x60))(local_258,Writer,PartitionLabel,&local_188,uVar1);
      Kumu::Result_t::operator=((Result_t *)(local_258 + 0x68),(Result_t *)local_258);
      Kumu::Result_t::~Result_t((Result_t *)local_258);
      if (-1 < (int)(ui32_t)local_1f0[0]._vptr_FrameBuffer) {
        FrameBuffer::Capacity((FrameBuffer *)local_258,(ui32_t)&local_2c8);
        Kumu::Result_t::operator=((Result_t *)(local_258 + 0x68),(Result_t *)local_258);
        Kumu::Result_t::~Result_t((Result_t *)local_258);
      }
      if (-1 < (int)(ui32_t)local_1f0[0]._vptr_FrameBuffer) {
        memset((void *)CONCAT71(local_2c8.m_Data._1_7_,local_2c8.m_Data._0_1_),0,(ulong)uVar1);
        Kumu::FileWriter::Write
                  ((uchar *)local_168,(uint)PartitionLabel,
                   (uint *)CONCAT71(local_2c8.m_Data._1_7_,local_2c8.m_Data._0_1_));
        Kumu::Result_t::~Result_t(local_168);
        if (local_258._0_4_ != uVar1) {
          __assert_fail("write_count == klv_fill_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                        ,0x414,
                        "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter &, ui32_t)"
                       );
        }
      }
    }
    FrameBuffer::~FrameBuffer(&local_2c8);
    if (uVar10 < 0x14) goto LAB_001a8c23;
  }
  Kumu::Result_t::Result_t((Result_t *)this_00,(Result_t *)(local_258 + 0x68));
LAB_001a8c23:
  Kumu::Result_t::~Result_t((Result_t *)(local_258 + 0x68));
  FrameBuffer::~FrameBuffer(&local_2a0);
  return this_00;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter& Writer, ui32_t HeaderSize)
{
  assert(m_Dict);
  if ( m_Preface == 0 )
    return RESULT_STATE;

  if ( HeaderSize < 4096 ) 
    {
      DefaultLogSink().Error("HeaderSize %u is too small. Must be >= 4096\n", HeaderSize);
      return RESULT_PARAM;
    }

  ASDCP::FrameBuffer HeaderBuffer;
  HeaderByteCount = HeaderSize - ArchiveSize();
  assert (HeaderByteCount <= 0xFFFFFFFFL);
  Result_t result = HeaderBuffer.Capacity((ui32_t) HeaderByteCount); 
  m_Preface->m_Lookup = &m_Primer;

  std::list<InterchangeObject*>::iterator pl_i = m_PacketList->m_List.begin();
  for ( ; pl_i != m_PacketList->m_List.end() && ASDCP_SUCCESS(result); pl_i++ )
    {
      InterchangeObject* object = *pl_i;
      object->m_Lookup = &m_Primer;

      ASDCP::FrameBuffer WriteWrapper;
      WriteWrapper.SetData(HeaderBuffer.Data() + HeaderBuffer.Size(),
			   HeaderBuffer.Capacity() - HeaderBuffer.Size());
      result = object->WriteToBuffer(WriteWrapper);
      HeaderBuffer.Size(HeaderBuffer.Size() + WriteWrapper.Size());
    }

  if ( ASDCP_SUCCESS(result) )
    {
      UL TmpUL(m_Dict->ul(MDD_ClosedCompleteHeader));
      result = Partition::WriteToFile(Writer, TmpUL);
    }

  if ( ASDCP_SUCCESS(result) )
    result = m_Primer.WriteToFile(Writer);

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t write_count;
      Writer.Write(HeaderBuffer.RoData(), HeaderBuffer.Size(), &write_count);
      assert(write_count == HeaderBuffer.Size());
    }

  // KLV Fill
  if ( ASDCP_SUCCESS(result) )
    {
      Kumu::fpos_t pos = Writer.TellPosition();

      if ( pos > (Kumu::fpos_t)HeaderByteCount )
	{
	  char intbuf[IntBufferLen];
	  DefaultLogSink().Error("Header size %s exceeds specified value %u\n",
				 ui64sz(pos, intbuf),
				 HeaderSize);
	  return RESULT_FAIL;
	}

      ASDCP::FrameBuffer NilBuf;
      ui32_t klv_fill_length = HeaderSize - (ui32_t)pos;

      if ( klv_fill_length < kl_length )
	{
	  DefaultLogSink().Error("Remaining region too small for KLV Fill header\n");
	  return RESULT_FAIL;
	}

      klv_fill_length -= kl_length;
      result = WriteKLToFile(Writer, m_Dict->ul(MDD_KLVFill), klv_fill_length);

      if ( ASDCP_SUCCESS(result) )
	result = NilBuf.Capacity(klv_fill_length);

      if ( ASDCP_SUCCESS(result) )
	{
	  memset(NilBuf.Data(), 0, klv_fill_length);
	  ui32_t write_count;
	  Writer.Write(NilBuf.RoData(), klv_fill_length, &write_count);
	  assert(write_count == klv_fill_length);
	}
    }

  return result;
}